

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralType.cc
# Opt level: O2

LiteralType flow::elementTypeOf(LiteralType type)

{
  FILE *__stream;
  allocator<char> local_31;
  undefined8 local_30 [4];
  
  __stream = _stderr;
  if ((type < (CidrArray|Boolean)) && ((0x1fefU >> (type & 0x1f) & 1) != 0)) {
    return *(LiteralType *)(&DAT_00161b1c + (ulong)type * 4);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"InvalidArgumentError",&local_31);
  fprintf(__stream,"%s\n",local_30[0]);
  std::__cxx11::string::~string((string *)local_30);
  abort();
}

Assistant:

LiteralType elementTypeOf(LiteralType type) {
  switch (type) {
    case LiteralType::Void:
    case LiteralType::Boolean:
    case LiteralType::Number:
    case LiteralType::String:
    case LiteralType::IPAddress:
    case LiteralType::Cidr:
    case LiteralType::RegExp:
    case LiteralType::Handler:
      return type;
    case LiteralType::IntArray:
      return LiteralType::Number;
    case LiteralType::StringArray:
      return LiteralType::String;
    case LiteralType::IPAddrArray:
      return LiteralType::IPAddress;
    case LiteralType::CidrArray:
      return LiteralType::Cidr;
    default:
      FLOW_ASSERT(false, "InvalidArgumentError");
  }
}